

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O2

int maxdirsterid<btVector3>(btVector3 *p,int count,btVector3 *dir,btAlignedObjectArray<int> *allow)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar8;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  btVector3 bVar9;
  btVector3 u;
  btVector3 local_78;
  btVector3 local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  
  do {
    iVar1 = maxdirfiltered<btVector3>(p,count,dir,allow);
    if (allow->m_data[iVar1] == 3) {
      return iVar1;
    }
    u = orth(dir);
    bVar9 = btVector3::cross(&u,dir);
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._0_8_ = bVar9.m_floats._0_8_;
    local_48._12_4_ = extraout_XMM0_Dd;
    local_58._8_4_ = in_XMM1_Dc;
    local_58._0_8_ = bVar9.m_floats._8_8_;
    local_58._12_4_ = in_XMM1_Dd;
    fVar8 = 0.0;
    iVar4 = -1;
    while( true ) {
      in_XMM1_Dd = 0;
      in_XMM1_Dc = 0;
      if (360.0 < fVar8) break;
      fVar5 = sinf(fVar8 * 0.017453292);
      fVar6 = cosf(fVar8 * 0.017453292);
      local_78.m_floats[1] = (fVar6 * (float)local_48._4_4_ + fVar5 * u.m_floats[1]) * 0.025;
      local_78.m_floats[0] = (fVar6 * (float)local_48._0_4_ + fVar5 * u.m_floats[0]) * 0.025;
      local_78.m_floats[2] = ((float)local_58._0_4_ * fVar6 + u.m_floats[2] * fVar5) * 0.025;
      local_78.m_floats[3] = 0.0;
      local_68 = operator+(dir,&local_78);
      iVar2 = maxdirfiltered<btVector3>(p,count,&local_68,allow);
      if (iVar2 == iVar1 && iVar4 == iVar1) {
LAB_00125795:
        allow->m_data[iVar1] = 3;
        return iVar1;
      }
      if (iVar4 != iVar2 && iVar4 != -1) {
        for (fVar5 = fVar8 + -40.0; fVar5 <= fVar8; fVar5 = fVar5 + 5.0) {
          fVar6 = sinf(fVar5 * 0.017453292);
          fVar7 = cosf(fVar5 * 0.017453292);
          local_78.m_floats[1] = (fVar7 * (float)local_48._4_4_ + fVar6 * u.m_floats[1]) * 0.025;
          local_78.m_floats[0] = (fVar7 * (float)local_48._0_4_ + fVar6 * u.m_floats[0]) * 0.025;
          local_78.m_floats[2] = ((float)local_58._0_4_ * fVar7 + u.m_floats[2] * fVar6) * 0.025;
          local_78.m_floats[3] = 0.0;
          local_68 = operator+(dir,&local_78);
          iVar3 = maxdirfiltered<btVector3>(p,count,&local_68,allow);
          if (iVar3 == iVar1 && iVar4 == iVar1) goto LAB_00125795;
          iVar4 = iVar3;
        }
      }
      fVar8 = fVar8 + 45.0;
      iVar4 = iVar2;
    }
    allow->m_data[iVar1] = 0;
  } while( true );
}

Assistant:

int maxdirsterid(const T *p,int count,const T &dir,btAlignedObjectArray<int> &allow)
{
	int m=-1;
	while(m==-1)
	{
		m = maxdirfiltered(p,count,dir,allow);
		if(allow[m]==3) return m;
		T u = orth(dir);
		T v = btCross(u,dir);
		int ma=-1;
		for(btScalar x = btScalar(0.0) ; x<= btScalar(360.0) ; x+= btScalar(45.0))
		{
			btScalar s = btSin(SIMD_RADS_PER_DEG*(x));
			btScalar c = btCos(SIMD_RADS_PER_DEG*(x));
			int mb = maxdirfiltered(p,count,dir+(u*s+v*c)*btScalar(0.025),allow);
			if(ma==m && mb==m)
			{
				allow[m]=3;
				return m;
			}
			if(ma!=-1 && ma!=mb)  // Yuck - this is really ugly
			{
				int mc = ma;
				for(btScalar xx = x-btScalar(40.0) ; xx <= x ; xx+= btScalar(5.0))
				{
					btScalar s = btSin(SIMD_RADS_PER_DEG*(xx));
					btScalar c = btCos(SIMD_RADS_PER_DEG*(xx));
					int md = maxdirfiltered(p,count,dir+(u*s+v*c)*btScalar(0.025),allow);
					if(mc==m && md==m)
					{
						allow[m]=3;
						return m;
					}
					mc=md;
				}
			}
			ma=mb;
		}
		allow[m]=0;
		m=-1;
	}
	btAssert(0);
	return m;
}